

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_subarray(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  byte bVar1;
  JSValueUnion JVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  JSValueUnion JVar6;
  JSValue *argv_00;
  ulong uVar7;
  JSObject *p;
  JSRefCountHeader *p_1;
  JSValue this_val_00;
  JSValue v;
  JSValue JVar8;
  int final;
  int start;
  int local_84;
  uint local_80;
  int local_7c;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  undefined8 local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  undefined8 local_40;
  
  uVar5 = CONCAT44(in_register_0000000c,argc);
  JVar6 = this_val.u;
  if (((int)this_val.tag == -1) && ((ushort)(*(short *)((long)JVar6.ptr + 6) - 0x15U) < 9)) {
    iVar4 = *(int *)((long)JVar6.ptr + 0x40);
    argv_00 = (JSValue *)0x0;
    iVar3 = JS_ToInt32Clamp(ctx,&local_7c,*argv,0,iVar4,iVar4);
    if (iVar3 != 0) {
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    local_84 = iVar4;
    if ((int)argv[1].tag != 3) {
      argv_00 = (JSValue *)0x0;
      JVar8.tag = argv[1].tag;
      JVar8.u.ptr = argv[1].u.ptr;
      iVar4 = JS_ToInt32Clamp(ctx,&local_84,JVar8,0,iVar4,iVar4);
      if (iVar4 != 0) goto LAB_0016ba8c;
    }
    uVar7 = (ulong)(uint)(local_84 - local_7c);
    if (local_84 - local_7c < 1) {
      uVar7 = 0;
    }
    JVar8 = js_typed_array_get_byteOffset(ctx,this_val,0);
    if ((uint)JVar8.tag == 6) goto LAB_0016ba8c;
    bVar1 = "includes"[(ulong)*(ushort *)((long)JVar6.ptr + 6) + 1];
    uVar5 = (ulong)bVar1;
    if ((0xfffffff4 < (uint)JVar8.tag) &&
       (iVar4 = *JVar8.u.ptr, *(int *)JVar8.u.ptr = iVar4 + -1, iVar4 < 2)) {
      local_80 = (uint)bVar1;
      __JS_FreeValueRT(ctx->rt,JVar8);
      uVar5 = (ulong)local_80;
    }
    if ((ushort)(*(short *)((long)JVar6.ptr + 6) - 0x15U) < 9) {
      JVar2 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)JVar6.ptr + 0x30) + 0x18))->ptr;
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
      local_58 = (ulong)(uint)((local_7c << ((byte)uVar5 & 0x1f)) + JVar8.u._0_4_);
      local_60 = 0xffffffffffffffff;
      local_50 = 0;
      local_40 = 0;
      this_val_00.tag = (int64_t)&local_78;
      this_val_00.u.float64 = 1.97626258336499e-323;
      local_78 = JVar6;
      local_70 = this_val.tag;
      local_68 = JVar2;
      local_48 = uVar7;
      JVar8 = js_typed_array___speciesCreate(ctx,this_val_00,(int)uVar7,argv_00);
      iVar4 = *JVar2.ptr;
      *(int *)JVar2.ptr = iVar4 + -1;
      if (1 < iVar4) {
        return JVar8;
      }
      v.tag = -1;
      v.u.ptr = JVar2.ptr;
      __JS_FreeValueRT(ctx->rt,v);
      return JVar8;
    }
  }
  JS_ThrowTypeError(ctx,"not a %s","TypedArray",uVar5);
LAB_0016ba8c:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_subarray(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValueConst args[4];
    JSValue arr, byteOffset, ta_buffer;
    JSObject *p;
    int len, start, final, count, shift, offset;

    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        goto exception;
    len = p->u.array.count;
    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;

    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);
    byteOffset = js_typed_array_get_byteOffset(ctx, this_val, 0);
    if (JS_IsException(byteOffset))
        goto exception;
    shift = typed_array_size_log2(p->class_id);
    offset = JS_VALUE_GET_INT(byteOffset) + (start << shift);
    JS_FreeValue(ctx, byteOffset);
    ta_buffer = js_typed_array_get_buffer(ctx, this_val, 0);
    if (JS_IsException(ta_buffer))
        goto exception;
    args[0] = this_val;
    args[1] = ta_buffer;
    args[2] = JS_NewInt32(ctx, offset);
    args[3] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 4, args);
    JS_FreeValue(ctx, ta_buffer);
    return arr;

 exception:
    return JS_EXCEPTION;
}